

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOutput_printTestsEnded_TestShell::~TEST_TestOutput_printTestsEnded_TestShell
          (TEST_TestOutput_printTestsEnded_TestShell *this)

{
  TEST_TestOutput_printTestsEnded_TestShell *this_local;
  
  ~TEST_TestOutput_printTestsEnded_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestOutput, printTestsEnded)
{
    result->countTest();
    result->countCheck();
    result->countIgnored();
    result->countIgnored();
    result->countRun();
    result->countRun();
    result->countRun();
    printer->printTestsEnded(*result);
    STRCMP_EQUAL("\nOK (1 tests, 3 ran, 1 checks, 2 ignored, 0 filtered out, 10 ms)\n\n", mock->getOutput().asCharString());
}